

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_into_linear<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
          (hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
          *value,not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  ulong uVar1;
  uint64_t this_00;
  address aVar2;
  address *paVar3;
  size_t i;
  ulong uVar4;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  pair<pstore::index::details::index_pointer,_bool> pVar6;
  linear_node local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::index::details::empty_class>
  *local_40;
  hamt_map<std::__cxx11::string,pstore::index::details::empty_class,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *local_38;
  
  local_38 = this;
  details::linear_node::get_node
            ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
              *)&local_58,transaction->db_,node);
  this_00 = local_58.size_;
  local_58.size_ = 0;
  local_58.signature_._M_elems[0] = '\0';
  local_58.signature_._M_elems[1] = '\0';
  local_58.signature_._M_elems[2] = '\0';
  local_58.signature_._M_elems[3] = '\0';
  local_58.signature_._M_elems[4] = '\0';
  local_58.signature_._M_elems[5] = '\0';
  local_58.signature_._M_elems[6] = '\0';
  local_58.signature_._M_elems[7] = '\0';
  if (local_58.leaves_[0].a_ == 0) {
    assert_failed("orig_node != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x368);
  }
  local_40 = value;
  pVar5 = details::linear_node::
          lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
                    ((linear_node *)local_58.leaves_[0].a_,transaction->db_,value);
  i = pVar5.second;
  if (i == 0xffffffffffffffff) {
    details::linear_node::allocate_from(&local_58,(linear_node *)local_58.leaves_[0].a_,1);
    i = *(uint64_t *)((long)local_58.leaves_[0].a_ + 8);
    aVar2 = store_leaf_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                      (local_38,transaction,local_40,parents);
    paVar3 = details::linear_node::operator[]((linear_node *)local_58.signature_._M_elems,i);
    paVar3->a_ = aVar2.a_;
    node.internal_ = (internal_node *)((ulong)local_58.signature_._M_elems | 3);
    uVar4 = 0;
  }
  else {
    if (is_upsert) {
      if (((ulong)node.internal_ & 2) == 0) {
        details::linear_node::allocate_from(&local_58,(linear_node *)local_58.leaves_[0].a_,0);
        node.internal_ = (internal_node *)((ulong)local_58.signature_._M_elems | 3);
        local_58.leaves_[0].a_ = (address)(address)local_58.signature_._M_elems;
      }
      else {
        local_58.leaves_[0].a_ = (address)((ulong)node.internal_ & 0xfffffffffffffffc);
      }
      aVar2 = store_leaf_node<std::pair<std::__cxx11::string,pstore::index::details::empty_class>>
                        (local_38,transaction,local_40,parents);
      paVar3 = details::linear_node::operator[]((linear_node *)local_58.leaves_[0].a_,i);
      paVar3->a_ = aVar2.a_;
    }
    else {
      aVar2 = details::linear_node::operator[](local_58.leaves_[0].a_,i);
      uVar4 = (parents.ptr_)->elements_;
      if (0xc < uVar4) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      (parents.ptr_)->elements_ = uVar4 + 1;
      ((parents.ptr_)->c_)._M_elems[uVar4].node.addr_.a_ = aVar2.a_;
      ((parents.ptr_)->c_)._M_elems[uVar4].position = 0xffffffffffffffff;
    }
    uVar4 = CONCAT71(local_58.leaves_[0].a_._1_7_,1);
  }
  uVar1 = (parents.ptr_)->elements_;
  if (0xc < uVar1) {
    assert_failed("elements_ < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                  ,100);
  }
  (parents.ptr_)->elements_ = uVar1 + 1;
  ((parents.ptr_)->c_)._M_elems[uVar1].node.internal_ = (internal_node *)node;
  ((parents.ptr_)->c_)._M_elems[uVar1].position = i;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  pVar6._8_8_ = uVar4 & 0xffffffff;
  pVar6.first.internal_ = node.internal_;
  return pVar6;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_linear (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            gsl::not_null<parent_stack *> parents, bool const is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;

            std::shared_ptr<linear_node const> lptr;
            linear_node const * orig_node = nullptr;
            std::tie (lptr, orig_node) = linear_node::get_node (transaction.db (), node);
            PSTORE_ASSERT (orig_node != nullptr);

            index_pointer child_slot;
            auto index = std::size_t{0};

            std::tie (child_slot, index) =
                orig_node->lookup<KeyType> (transaction.db (), value.first, equal_);
            if (index == details::not_found) {
                // The key wasn't present in the node so we simply append it.
                // TODO: keep these entries sorted?

                // Load into memory with space for 1 new child node.
                std::unique_ptr<linear_node> new_node = linear_node::allocate_from (*orig_node, 1U);
                index = orig_node->size ();
                (*new_node)[index] = this->store_leaf_node (transaction, value, parents);
                result = new_node.release ();
            } else {
                key_exists = true;
                if (is_upsert) {
                    std::unique_ptr<linear_node> new_node;
                    linear_node * lnode = nullptr;

                    if (node.is_heap ()) {
                        // If the node is already on the heap then there's no need to reallocate it.
                        lnode = node.untag<linear_node *> ();
                        result = node;
                    } else {
                        // Load into memory but no extra space.
                        new_node = linear_node::allocate_from (*orig_node, 0U);
                        lnode = new_node.get ();
                        result = lnode;
                    }
                    (*lnode)[index] = this->store_leaf_node (transaction, value, parents);
                    new_node.release ();
                } else {
                    parents->push (details::parent_type{index_pointer{(*orig_node)[index]}});

                    // We didn't modify the node so our return value is the original node index
                    // pointer.
                    result = node;
                }
            }

            parents->push (details::parent_type{result, index});
            return {result, key_exists};
        }